

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionModelBullet::GetAABB
          (ChCollisionModelBullet *this,ChVector<double> *bbmin,ChVector<double> *bbmax)

{
  cbtCollisionObject *pcVar1;
  cbtCollisionShape *pcVar2;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined1 auVar3 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar4 [16];
  undefined1 in_ZMM3 [64];
  cbtVector3 btmax;
  cbtVector3 btmin;
  ulong local_40;
  float local_38;
  ulong local_30;
  float local_28;
  
  auVar4 = in_ZMM3._0_16_;
  auVar3 = in_ZMM2._0_16_;
  pcVar1 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  pcVar2 = pcVar1->m_collisionShape;
  if (pcVar2 != (cbtCollisionShape *)0x0) {
    (*pcVar2->_vptr_cbtCollisionShape[2])(pcVar2,&pcVar1->m_worldTransform,&local_30,&local_40);
    in_XMM1_Qa = (double)local_28;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_30;
    auVar3 = vcvtps2pd_avx(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40;
    auVar4 = vcvtps2pd_avx(auVar4);
    in_XMM0_Qa = (double)local_38;
  }
  *(undefined1 (*) [16])bbmin->m_data = auVar3;
  bbmin->m_data[2] = in_XMM1_Qa;
  *(undefined1 (*) [16])bbmax->m_data = auVar4;
  bbmax->m_data[2] = in_XMM0_Qa;
  return;
}

Assistant:

void ChCollisionModelBullet::GetAABB(ChVector<>& bbmin, ChVector<>& bbmax) const {
    cbtVector3 btmin;
    cbtVector3 btmax;
    if (bt_collision_object->getCollisionShape())
        bt_collision_object->getCollisionShape()->getAabb(bt_collision_object->getWorldTransform(), btmin, btmax);
    bbmin.Set(btmin.x(), btmin.y(), btmin.z());
    bbmax.Set(btmax.x(), btmax.y(), btmax.z());
}